

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  bool bVar6;
  slot_type *psVar7;
  ulong uVar8;
  iterator iVar9;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10) || psVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)(kEmptyGroup + 0x10) && psVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar2 < ~kSentinel)) goto LAB_00e2e924;
    if (psVar1 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_00e2e917:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00e2e917;
      if ((psVar2 == (slot_type *)kSooControl) == (psVar1 == (slot_type *)kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)kSooControl) {
          bVar6 = (slot_type *)a == psVar3;
        }
        else {
          psVar7 = psVar3;
          psVar4 = psVar2;
          psVar5 = (slot_type *)a;
          if (psVar2 < psVar1) {
            psVar7 = (slot_type *)a;
            psVar4 = psVar1;
            psVar5 = psVar3;
          }
          b = (iterator *)CONCAT71((int7)((ulong)psVar4 >> 8),psVar4 < psVar5);
          bVar6 = psVar5 <= psVar7 && psVar4 < psVar5;
        }
        if (bVar6) goto LAB_00e2e917;
      }
      goto LAB_00e2e92e;
    }
  }
  else {
    operator==();
LAB_00e2e924:
    operator==();
  }
  operator==();
LAB_00e2e92e:
  operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
  ::AssertHashEqConsistent<google::protobuf::FileDescriptor_const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
              *)a,(FileDescriptor **)b);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)a);
  uVar8 = ((ulong)b->ctrl_ ^ 0x1976508) * -0x234dd359734ecb13;
  uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)b->ctrl_) * -0x234dd359734ecb13;
  iVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
          ::find_non_soo<google::protobuf::FileDescriptor_const*>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
                      *)a,(key_arg<const_google::protobuf::FileDescriptor_*> *)b,
                     uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
  return iVar9.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }